

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O3

int main(int argc,char **argv)

{
  pointer pcVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  _Elt_pointer pSVar4;
  double *pdVar5;
  _Map_pointer ppSVar6;
  Pacman_AI_Agent PVar7;
  uint uVar8;
  uint uVar9;
  RL_Pacman_Agent *pRVar10;
  undefined **ppuVar11;
  NN_Pacman_Agent *this;
  _Elt_pointer pSVar12;
  ulong uVar13;
  long *plVar14;
  undefined8 *puVar15;
  ostream *poVar16;
  size_t sVar17;
  uint uVar18;
  double *pdVar19;
  ulong uVar20;
  long *plVar21;
  size_type *psVar22;
  ulong uVar23;
  uint uVar24;
  long lVar25;
  char *pcVar26;
  undefined4 in_register_0000003c;
  int iVar27;
  uint __len;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar28;
  bool bVar29;
  double dVar30;
  Neural_Network *pNVar31;
  double dVar32;
  double dVar33;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  vector<Neural_Network,_std::allocator<Neural_Network>_> max_nns;
  string statistics_path;
  string arguments_json;
  string nn_id;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  json;
  vector<Neural_Network,_std::allocator<Neural_Network>_> last_nns;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  arguments;
  string __str_1;
  string __str;
  stringstream ss;
  char str [200];
  Game game;
  int local_c50;
  allocator_type local_c49;
  undefined1 local_c48 [16];
  Neural_Network *local_c38;
  double dStack_c30;
  RL_Pacman_Agent *local_c28;
  vector<Neural_Network,_std::allocator<Neural_Network>_> local_c20;
  string local_c08;
  Neural_Network *local_be8;
  Neural_Network *pNStack_be0;
  double local_bd8;
  double dStack_bd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bc0;
  undefined1 *local_ba0;
  undefined8 local_b98;
  undefined1 local_b90 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b60;
  undefined1 local_b40 [8];
  _Deque_base<StatisticInfo,_std::allocator<StatisticInfo>_> _Stack_b38;
  undefined1 local_ae8 [16];
  double local_ad8;
  double dStack_ad0;
  double local_ac8;
  double dStack_ac0;
  uint local_ab8;
  undefined1 local_ab4 [8];
  undefined8 uStack_aac;
  undefined4 local_aa4;
  undefined4 uStack_aa0;
  undefined4 uStack_a9c;
  undefined4 uStack_a98;
  undefined4 uStack_a94;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined8 uStack_a80;
  undefined4 uStack_a78;
  undefined4 local_a74;
  undefined4 uStack_a70;
  undefined4 uStack_a6c;
  undefined4 uStack_a68;
  undefined4 local_a64;
  undefined1 local_a60 [16];
  double local_a50;
  double dStack_a48;
  double local_a40;
  double dStack_a38;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_a30;
  vector<Neural_Network,_std::allocator<Neural_Network>_> local_a18;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_a00;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_9e8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_9d0;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_9b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9a0;
  string local_980;
  string local_960;
  undefined1 local_940 [8];
  undefined1 auStack_938 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_930;
  undefined4 uStack_920;
  undefined4 local_91c;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined4 uStack_900;
  undefined4 local_8fc;
  undefined4 uStack_8f8;
  undefined4 uStack_8f4;
  undefined4 uStack_8f0;
  undefined4 local_8ec;
  undefined1 local_8e8 [16];
  undefined1 local_8d8 [16];
  undefined1 local_8c8 [272];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_798;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_778;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_758;
  undefined1 local_738 [8];
  pointer ppAStack_730;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_728;
  bool bStack_718;
  undefined2 uStack_717;
  double local_710;
  Matrix<char> local_708;
  __node_base_ptr *local_6e8;
  size_type local_6e0;
  __node_base local_6d8;
  size_type sStack_6d0;
  float local_6c8;
  size_t local_6c0;
  __node_base_ptr p_Stack_6b8;
  __node_base_ptr *local_6b0;
  size_type local_6a8;
  __node_base local_6a0;
  size_type sStack_698;
  float local_690;
  size_t local_688;
  __node_base_ptr p_Stack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  pointer local_668;
  pointer pGStack_660;
  pointer local_658;
  int local_650;
  int iStack_64c;
  int iStack_648;
  int iStack_644;
  ios_base local_640 [16];
  Matrix<char> local_630;
  __node_base_ptr *local_610;
  size_type local_608;
  __node_base local_600;
  size_type sStack_5f8;
  float local_5f0;
  size_t local_5e8;
  __node_base_ptr p_Stack_5e0;
  __node_base_ptr *local_5d8;
  size_type local_5d0;
  __node_base local_5c8;
  size_type sStack_5c0;
  float local_5b8;
  size_t local_5b0;
  __node_base_ptr p_Stack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  pointer local_590;
  pointer pGStack_588;
  pointer local_580;
  int local_578;
  int iStack_574;
  int iStack_570;
  int iStack_56c;
  Matrix<char> local_558;
  __node_base_ptr *local_538;
  size_type local_530;
  __node_base local_528;
  size_type sStack_520;
  float local_518;
  size_t local_510;
  __node_base_ptr p_Stack_508;
  __node_base_ptr *local_500;
  size_type local_4f8;
  __node_base local_4f0;
  size_type sStack_4e8;
  float local_4e0;
  size_t local_4d8;
  __node_base_ptr p_Stack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  pointer local_4b8;
  pointer pGStack_4b0;
  pointer local_4a8;
  int local_4a0;
  int iStack_49c;
  int iStack_498;
  int iStack_494;
  undefined2 local_480;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_478;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_438;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3f8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3b8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_378;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_338;
  Game local_2f8;
  
  lVar25 = std::cout;
  *(uint *)(std::__detail::_Prime_rehash_policy::_M_need_rehash + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__detail::_Prime_rehash_policy::_M_need_rehash + *(long *)(std::cout + -0x18))
       | 4;
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar25 + -0x18)) = 1;
  Arguments::init((Arguments *)CONCAT44(in_register_0000003c,argc),(EVP_PKEY_CTX *)argv);
  Arguments::postprocess();
  srand(Arguments::random_seed);
  local_2f8.result.state.pills._M_h._M_buckets = &local_2f8.result.state.pills._M_h._M_single_bucket
  ;
  local_2f8.result.state.maze.t.
  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2f8.result.state.maze.t.
  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2f8.result.state.maze.r = 0;
  local_2f8.result.state.maze.c = 0;
  local_2f8.result.state.maze.t.
  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2f8.ghosts.super__Vector_base<Agent_*,_std::allocator<Agent_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2f8.ghosts.super__Vector_base<Agent_*,_std::allocator<Agent_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2f8.ghosts.super__Vector_base<Agent_*,_std::allocator<Agent_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2f8.pacman = (Agent *)0x0;
  local_2f8.result.state.pills._M_h._M_bucket_count = 1;
  local_2f8.result.state.pills._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_2f8.result.state.pills._M_h._M_element_count = 0;
  local_2f8.result.state.pills._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_2f8.result.state.pills._M_h._M_rehash_policy._M_next_resize = 0;
  local_2f8.result.state.pills._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_2f8.result.state.powerpills._M_h._M_buckets =
       &local_2f8.result.state.powerpills._M_h._M_single_bucket;
  local_2f8.result.state.powerpills._M_h._M_bucket_count = 1;
  local_2f8.result.state.powerpills._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_2f8.result.state.powerpills._M_h._M_element_count = 0;
  local_2f8.result.state.powerpills._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_2f8.result.state.powerpills._M_h._M_rehash_policy._M_next_resize = 0;
  local_2f8.result.state.powerpills._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_2f8.result.state.round = 0;
  local_2f8.result.state.n_rounds_powerpill = 0;
  local_2f8.result.state.n_normal_pills_left = 0;
  local_2f8.result.state.n_powerpills_left = 0;
  local_2f8.result.state.ghosts.super__Vector_base<Ghost_State,_std::allocator<Ghost_State>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2f8.result.state.ghosts.super__Vector_base<Ghost_State,_std::allocator<Ghost_State>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2f8.result.state.ghosts.super__Vector_base<Ghost_State,_std::allocator<Ghost_State>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2f8.result.state.pacman.pos.i = -1;
  local_2f8.result.state.pacman.pos.j = -1;
  local_2f8.result.state.pacman.prev.i = -1;
  local_2f8.result.state.pacman.prev.j = -1;
  local_2f8.initialState.maze.t.
  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2f8.initialState.maze.t.
  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2f8.initialState.maze.r = 0;
  local_2f8.initialState.maze.c = 0;
  local_2f8.initialState.maze.t.
  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2f8.initialState.pills._M_h._M_buckets = &local_2f8.initialState.pills._M_h._M_single_bucket
  ;
  local_2f8.initialState.pills._M_h._M_bucket_count = 1;
  local_2f8.initialState.pills._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_2f8.initialState.pills._M_h._M_element_count = 0;
  local_2f8.initialState.pills._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_2f8.initialState.pills._M_h._M_rehash_policy._M_next_resize = 0;
  local_2f8.initialState.pills._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_2f8.initialState.powerpills._M_h._M_buckets =
       &local_2f8.initialState.powerpills._M_h._M_single_bucket;
  local_2f8.initialState.powerpills._M_h._M_bucket_count = 1;
  local_2f8.initialState.powerpills._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_2f8.initialState.powerpills._M_h._M_element_count = 0;
  local_2f8.initialState.powerpills._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_2f8.initialState.powerpills._M_h._M_rehash_policy._M_next_resize = 0;
  local_2f8.initialState.powerpills._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_2f8.initialState.round = 0;
  local_2f8.initialState.n_rounds_powerpill = 0;
  local_2f8.initialState.n_normal_pills_left = 0;
  local_2f8.initialState.n_powerpills_left = 0;
  local_2f8.initialState.ghosts.super__Vector_base<Ghost_State,_std::allocator<Ghost_State>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2f8.initialState.ghosts.super__Vector_base<Ghost_State,_std::allocator<Ghost_State>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2f8.initialState.ghosts.super__Vector_base<Ghost_State,_std::allocator<Ghost_State>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2f8.initialState.pacman.pos.i = -1;
  local_2f8.initialState.pacman.pos.j = -1;
  local_2f8.initialState.pacman.prev.i = -1;
  local_2f8.initialState.pacman.prev.j = -1;
  local_2f8.state.maze.t.
  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2f8.state.maze.t.
  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2f8.state.maze.r = 0;
  local_2f8.state.maze.c = 0;
  local_2f8.state.maze.t.
  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2f8.state.pills._M_h._M_buckets = &local_2f8.state.pills._M_h._M_single_bucket;
  local_2f8.state.pills._M_h._M_bucket_count = 1;
  local_2f8.state.pills._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_2f8.state.pills._M_h._M_element_count = 0;
  local_2f8.state.pills._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_2f8.state.pills._M_h._M_rehash_policy._M_next_resize = 0;
  local_2f8.state.pills._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_2f8.state.powerpills._M_h._M_buckets = &local_2f8.state.powerpills._M_h._M_single_bucket;
  local_2f8.state.powerpills._M_h._M_bucket_count = 1;
  local_2f8.state.powerpills._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_2f8.state.powerpills._M_h._M_element_count = 0;
  local_2f8.state.powerpills._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_2f8.state.ghosts.super__Vector_base<Ghost_State,_std::allocator<Ghost_State>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2f8.state.ghosts.super__Vector_base<Ghost_State,_std::allocator<Ghost_State>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2f8.state.ghosts.super__Vector_base<Ghost_State,_std::allocator<Ghost_State>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2f8.state.round = 0;
  local_2f8.state.n_rounds_powerpill = 0;
  local_2f8.state.n_normal_pills_left = 0;
  local_2f8.state.n_powerpills_left = 0;
  local_2f8.state.powerpills._M_h._M_rehash_policy._M_next_resize = 0;
  local_2f8.state.powerpills._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_2f8.state.pacman.pos.i = -1;
  local_2f8.state.pacman.pos.j = -1;
  local_2f8.state.pacman.prev.i = -1;
  local_2f8.state.pacman.prev.j = -1;
  local_2f8.loaded_maze = false;
  local_2f8.game_over = false;
  Game::load_maze(&local_2f8);
  switch(Arguments::pacman_ai_agent) {
  case PATHFINDING:
    pRVar10 = (RL_Pacman_Agent *)operator_new(8);
    ppuVar11 = &PTR_take_action_00120b80;
    break;
  case INPUT:
    pRVar10 = (RL_Pacman_Agent *)operator_new(8);
    ppuVar11 = &PTR_take_action_00120c08;
    break;
  case RANDOM:
    pRVar10 = (RL_Pacman_Agent *)operator_new(8);
    ppuVar11 = &PTR_take_action_00120c60;
    break;
  case RL:
    pRVar10 = (RL_Pacman_Agent *)operator_new(0x118);
    RL_Pacman_Agent::RL_Pacman_Agent(pRVar10);
    goto LAB_001078e2;
  case NN:
    pRVar10 = (RL_Pacman_Agent *)operator_new(200);
    local_960._M_dataplus._M_p = (pointer)&local_960.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_960,Arguments::neural_network_path_abi_cxx11_._M_dataplus._M_p,
               Arguments::neural_network_path_abi_cxx11_._M_dataplus._M_p +
               Arguments::neural_network_path_abi_cxx11_._M_string_length);
    NN_Pacman_Agent::NN_Pacman_Agent((NN_Pacman_Agent *)pRVar10,&local_960);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_960._M_dataplus._M_p != &local_960.field_2) {
      operator_delete(local_960._M_dataplus._M_p);
    }
    goto LAB_001078e2;
  default:
    local_728._M_local_buf[0] = 'I';
    local_728._M_local_buf[1] = ' ';
    local_728._M_local_buf[2] = 'A';
    local_728._M_local_buf[3] = 'g';
    local_728._M_local_buf[4] = 'e';
    local_728._M_local_buf[5] = 'n';
    local_728._M_local_buf[6] = 't';
    local_728._M_local_buf[7] = ' ';
    local_728._8_7_ = 0x6176206d756e65;
    local_738[0] = 'I';
    local_738[1] = 'n';
    local_738[2] = 'v';
    local_738[3] = 'a';
    local_738[4] = 'l';
    local_738[5] = 'i';
    local_738[6] = 'd';
    local_738[7] = ' ';
    ppAStack_730 = (pointer)0x41206e616d636170;
    local_728._M_local_buf[0xf] = 'l';
    bStack_718 = true;
    uStack_717 = 0x65;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Error[",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/albertsgrc[P]q-mspacman/src/main.cc"
               ,0x5a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"][",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"main",4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"][Line ",7);
    poVar16 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x98);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,"] ",2);
    sVar17 = strlen(local_738);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,local_738,sVar17);
    std::endl<char,std::char_traits<char>>(poVar16);
    exit(1);
  }
  (pRVar10->super_Agent)._vptr_Agent = (_func_int **)ppuVar11;
LAB_001078e2:
  local_b40._0_4_ = Arguments::logging_statistics_precision;
  stack0xfffffffffffff4c4 = 0;
  _Stack_b38._M_impl.super__Deque_impl_data._4_8_ = 0;
  _Stack_b38._M_impl.super__Deque_impl_data._M_map_size._4_4_ = 0;
  _Stack_b38._M_impl.super__Deque_impl_data._M_start._M_cur._0_4_ = 0;
  _Stack_b38._M_impl.super__Deque_impl_data._M_start._M_cur._4_4_ = 0;
  _Stack_b38._M_impl.super__Deque_impl_data._M_start._M_first._0_4_ = 0;
  _Stack_b38._M_impl.super__Deque_impl_data._M_start._M_first._4_4_ = 0;
  _Stack_b38._M_impl.super__Deque_impl_data._M_start._M_last._0_4_ = 0;
  _Stack_b38._M_impl.super__Deque_impl_data._M_start._M_last._4_4_ = 0;
  _Stack_b38._M_impl.super__Deque_impl_data._M_start._M_node._0_4_ = 0;
  _Stack_b38._M_impl.super__Deque_impl_data._M_start._M_node._4_4_ = 0;
  _Stack_b38._M_impl.super__Deque_impl_data._M_finish._M_cur._0_4_ = 0;
  _Stack_b38._M_impl.super__Deque_impl_data._M_finish._M_cur._4_4_ = 0;
  _Stack_b38._M_impl.super__Deque_impl_data._M_finish._M_first._0_4_ = 0;
  _Stack_b38._M_impl.super__Deque_impl_data._M_finish._M_first._4_4_ = 0;
  _Stack_b38._M_impl.super__Deque_impl_data._M_finish._M_last._0_4_ = 0;
  _Stack_b38._M_impl.super__Deque_impl_data._M_finish._M_last._4_4_ = 0;
  _Stack_b38._M_impl.super__Deque_impl_data._M_finish._M_node._0_4_ = 0;
  _Stack_b38._M_impl.super__Deque_impl_data._M_finish._M_node._4_4_ = 0;
  local_2f8.pacman = &pRVar10->super_Agent;
  std::_Deque_base<StatisticInfo,_std::allocator<StatisticInfo>_>::_M_initialize_map
            ((_Deque_base<StatisticInfo,_std::allocator<StatisticInfo>_> *)(local_b40 + 8),0);
  local_ac8 = 0.0;
  dStack_ac0 = 0.0;
  local_ad8 = 0.0;
  dStack_ad0 = 0.0;
  local_ae8 = ZEXT816(0);
  local_ab8 = Arguments::test_statistics_precision;
  local_ab4 = (undefined1  [8])0x0;
  uStack_aac = 0;
  local_aa4 = 0;
  uStack_aa0 = 0;
  uStack_a9c = 0;
  uStack_a98 = 0;
  uStack_a94 = 0;
  uStack_a90._0_4_ = 0;
  uStack_a90._4_4_ = 0;
  uStack_a88._0_4_ = 0;
  uStack_a88._4_4_ = 0;
  uStack_a80._0_4_ = 0;
  uStack_a80._4_4_ = 0;
  uStack_a78 = 0;
  local_a74 = 0;
  uStack_a70 = 0;
  uStack_a6c = 0;
  uStack_a68 = 0;
  local_a64 = 0;
  std::_Deque_base<StatisticInfo,_std::allocator<StatisticInfo>_>::_M_initialize_map
            ((_Deque_base<StatisticInfo,_std::allocator<StatisticInfo>_> *)(local_ab4 + 4),0);
  local_a40 = 0.0;
  dStack_a38 = 0.0;
  local_a50 = 0.0;
  dStack_a48 = 0.0;
  local_a60 = ZEXT816(0);
  std::vector<Neural_Network,_std::allocator<Neural_Network>_>::vector
            (&local_c20,(long)Arguments::test_sampling,(allocator_type *)local_738);
  std::vector<Neural_Network,_std::allocator<Neural_Network>_>::vector
            (&local_a18,(long)Arguments::test_sampling,(allocator_type *)local_738);
  PVar7 = Arguments::pacman_ai_agent;
  local_c28 = pRVar10;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Wins || Completion",0x12);
  pcVar26 = "";
  if (PVar7 == RL) {
    pcVar26 = " || MSE";
  }
  lVar25 = 7;
  if (PVar7 != RL) {
    lVar25 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar26,lVar25);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," (Last ",7);
  poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar16," :: Always)",0xb);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
  std::ostream::put((char)poVar16);
  std::ostream::flush();
  if (0 < Arguments::plays) {
    dVar33 = (double)Arguments::plays * Arguments::nn_evaluation_start;
    local_be8 = &local_c28->nn;
    local_c48._0_8_ = 0xbff0000000000000;
    iVar27 = 0;
    do {
      if ((PVar7 == RL) && (iVar27 % Arguments::test_sampling_interval == 0)) {
        Neural_Network::from_weights
                  (local_a18.super__Vector_base<Neural_Network,_std::allocator<Neural_Network>_>.
                   _M_impl.super__Vector_impl_data._M_start +
                   (int)((long)((ulong)(uint)((int)((long)iVar27 %
                                                   (long)Arguments::test_statistics_precision) >>
                                             0x1f) << 0x20 |
                               (long)iVar27 % (long)Arguments::test_statistics_precision &
                               0xffffffffU) / (long)Arguments::test_sampling_interval),local_be8);
      }
      Game::play(&local_2f8);
      local_728._M_allocated_capacity = (size_type)(pointer)0x0;
      if (PVar7 == RL) {
        local_728._M_allocated_capacity =
             (size_type)((double)local_c28->mse_sum_last / (double)local_2f8.state.round);
      }
      local_738 = (undefined1  [8])(double)(int)local_2f8.result.won;
      ppAStack_730 = (pointer)local_2f8.result.completion;
      local_ae8._8_8_ = local_2f8.result.completion + (double)local_ae8._8_8_;
      local_ae8._0_8_ = (double)local_738 + (double)local_ae8._0_8_;
      local_ad8 = local_ad8 + (double)local_728._M_allocated_capacity;
      dStack_ad0 = dStack_ad0 + (double)local_738;
      local_ac8 = local_2f8.result.completion + local_ac8;
      dStack_ac0 = (double)local_728._M_allocated_capacity + dStack_ac0;
      if (_Stack_b38._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          (_Elt_pointer)
          (CONCAT44(_Stack_b38._M_impl.super__Deque_impl_data._M_finish._M_last._4_4_,
                    _Stack_b38._M_impl.super__Deque_impl_data._M_finish._M_last._0_4_) + -0x18)) {
        std::deque<StatisticInfo,std::allocator<StatisticInfo>>::
        _M_push_back_aux<StatisticInfo_const&>
                  ((deque<StatisticInfo,std::allocator<StatisticInfo>> *)(local_b40 + 8),
                   (StatisticInfo *)local_738);
        ppSVar6 = _Stack_b38._M_impl.super__Deque_impl_data._M_start._M_node;
      }
      else {
        (_Stack_b38._M_impl.super__Deque_impl_data._M_finish._M_cur)->mse =
             (double)local_728._M_allocated_capacity;
        (_Stack_b38._M_impl.super__Deque_impl_data._M_finish._M_cur)->won = (double)local_738;
        (_Stack_b38._M_impl.super__Deque_impl_data._M_finish._M_cur)->completion =
             local_2f8.result.completion;
        _Stack_b38._M_impl.super__Deque_impl_data._M_finish._M_cur =
             _Stack_b38._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
        ppSVar6 = _Stack_b38._M_impl.super__Deque_impl_data._M_start._M_node;
      }
      uVar9 = local_b40._4_4_;
      if ((uint)local_b40._0_4_ <= (uint)local_b40._4_4_) {
        pSVar4 = (_Elt_pointer)
                 CONCAT44(_Stack_b38._M_impl.super__Deque_impl_data._M_start._M_cur._4_4_,
                          _Stack_b38._M_impl.super__Deque_impl_data._M_start._M_cur._0_4_);
        if (pSVar4 == _Stack_b38._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
          local_c38 = (Neural_Network *)pSVar4->won;
          dStack_c30 = pSVar4->completion;
          local_bd8 = pSVar4->mse;
          _Stack_b38._M_impl.super__Deque_impl_data._M_start._M_node = ppSVar6;
          operator_delete((void *)CONCAT44(_Stack_b38._M_impl.super__Deque_impl_data._M_start.
                                           _M_first._4_4_,
                                           _Stack_b38._M_impl.super__Deque_impl_data._M_start.
                                           _M_first._0_4_));
          ppSVar6 = _Stack_b38._M_impl.super__Deque_impl_data._M_start._M_node + 1;
          pSVar12 = _Stack_b38._M_impl.super__Deque_impl_data._M_start._M_node[1];
          _Stack_b38._M_impl.super__Deque_impl_data._M_start._M_first._0_4_ = SUB84(pSVar12,0);
          _Stack_b38._M_impl.super__Deque_impl_data._M_start._M_first._4_4_ =
               (undefined4)((ulong)pSVar12 >> 0x20);
          _Stack_b38._M_impl.super__Deque_impl_data._M_start._M_last = pSVar12 + 0x15;
          pNVar31 = local_c38;
          dVar32 = dStack_c30;
          uVar9 = local_b40._4_4_;
          dVar30 = local_bd8;
        }
        else {
          pSVar12 = pSVar4 + 1;
          pNVar31 = (Neural_Network *)pSVar4->won;
          dVar32 = pSVar4->completion;
          dVar30 = pSVar4->mse;
        }
        _Stack_b38._M_impl.super__Deque_impl_data._M_start._M_cur._0_4_ = SUB84(pSVar12,0);
        _Stack_b38._M_impl.super__Deque_impl_data._M_start._M_cur._4_4_ =
             (undefined4)((ulong)pSVar12 >> 0x20);
        dVar32 = (double)local_ae8._8_8_ - dVar32;
        local_ae8._8_4_ = SUB84(dVar32,0);
        local_ae8._0_8_ = (double)local_ae8._0_8_ - (double)pNVar31;
        local_ae8._12_4_ = (int)((ulong)dVar32 >> 0x20);
        local_ad8 = local_ad8 - dVar30;
      }
      local_b40._4_4_ = uVar9 + 1;
      local_a60._8_8_ = (double)local_a60._8_8_ + (double)ppAStack_730;
      local_a60._0_8_ = (double)local_a60._0_8_ + (double)local_738;
      local_a50 = (double)local_728._M_allocated_capacity + local_a50;
      dStack_a48 = (double)local_738 + dStack_a48;
      local_a40 = (double)ppAStack_730 + local_a40;
      dStack_a38 = (double)local_728._M_allocated_capacity + dStack_a38;
      _Stack_b38._M_impl.super__Deque_impl_data._M_start._M_node = ppSVar6;
      if (uStack_a80 == (undefined8 *)(CONCAT44(uStack_a6c,uStack_a70) + -0x18)) {
        std::deque<StatisticInfo,std::allocator<StatisticInfo>>::
        _M_push_back_aux<StatisticInfo_const&>
                  ((deque<StatisticInfo,std::allocator<StatisticInfo>> *)(local_ab4 + 4),
                   (StatisticInfo *)local_738);
        lVar25 = uStack_a88;
      }
      else {
        uStack_a80[2] = local_728._M_allocated_capacity;
        *uStack_a80 = local_738;
        uStack_a80[1] = ppAStack_730;
        uStack_a80 = uStack_a80 + 3;
        lVar25 = uStack_a88;
      }
      uVar9 = local_ab4._0_4_;
      if (local_ab8 <= (uint)local_ab4._0_4_) {
        pdVar5 = (double *)CONCAT44(uStack_a9c,uStack_aa0);
        if (pdVar5 == uStack_a90 + -3) {
          local_c38 = (Neural_Network *)*pdVar5;
          dStack_c30 = pdVar5[1];
          local_bd8 = pdVar5[2];
          uStack_a88 = lVar25;
          operator_delete((void *)CONCAT44(uStack_a94,uStack_a98));
          lVar25 = uStack_a88 + 8;
          pdVar19 = *(double **)(uStack_a88 + 8);
          uStack_a98 = SUB84(pdVar19,0);
          uStack_a94 = (undefined4)((ulong)pdVar19 >> 0x20);
          uStack_a90 = pdVar19 + 0x3f;
          pNVar31 = local_c38;
          dVar32 = dStack_c30;
          uVar9 = local_ab4._0_4_;
          dVar30 = local_bd8;
        }
        else {
          pdVar19 = pdVar5 + 3;
          pNVar31 = (Neural_Network *)*pdVar5;
          dVar32 = pdVar5[1];
          dVar30 = pdVar5[2];
        }
        uStack_aa0 = SUB84(pdVar19,0);
        uStack_a9c = (undefined4)((ulong)pdVar19 >> 0x20);
        auVar2._8_4_ = SUB84((double)local_a60._8_8_ - dVar32,0);
        auVar2._0_8_ = (double)local_a60._0_8_ - (double)pNVar31;
        auVar2._12_4_ = (int)((ulong)((double)local_a60._8_8_ - dVar32) >> 0x20);
        local_a60 = auVar2;
        local_a50 = local_a50 - dVar30;
      }
      uVar9 = uVar9 + 1;
      local_ab4._0_4_ = uVar9;
      uStack_a88 = lVar25;
      if ((int)dVar33 <= iVar27 && PVar7 == RL) {
        uVar24 = local_ab8;
        if (uVar9 < local_ab8) {
          uVar24 = uVar9;
        }
        if ((int)uVar24 < 2) {
          uVar24 = 1;
        }
        dVar30 = *(double *)(local_a60 + (ulong)(Arguments::nn_evaluation_attribute != WINS) * 8) /
                 (double)(int)uVar24;
        if ((double)local_c48._0_8_ < dVar30) {
          if (local_c20.super__Vector_base<Neural_Network,_std::allocator<Neural_Network>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_c20.super__Vector_base<Neural_Network,_std::allocator<Neural_Network>_>._M_impl.
              super__Vector_impl_data._M_start) {
            local_c48._0_8_ = dVar30;
          }
          else {
            local_c48._0_8_ = dVar30;
            uVar20 = 0;
            uVar13 = 1;
            do {
              Neural_Network::from_weights
                        (local_c20.
                         super__Vector_base<Neural_Network,_std::allocator<Neural_Network>_>._M_impl
                         .super__Vector_impl_data._M_start + uVar20,
                         local_a18.
                         super__Vector_base<Neural_Network,_std::allocator<Neural_Network>_>._M_impl
                         .super__Vector_impl_data._M_start + uVar20);
              uVar20 = ((long)local_c20.
                              super__Vector_base<Neural_Network,_std::allocator<Neural_Network>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_c20.
                              super__Vector_base<Neural_Network,_std::allocator<Neural_Network>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 3) * -0x30c30c30c30c30c3;
              bVar29 = uVar13 <= uVar20;
              lVar25 = uVar20 - uVar13;
              uVar20 = uVar13;
              uVar13 = (ulong)((int)uVar13 + 1);
            } while (bVar29 && lVar25 != 0);
          }
        }
      }
      if (iVar27 % Arguments::logging_update_rate == Arguments::logging_update_rate + -1) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\r",1);
        print_info((Statistics *)local_b40,PVar7 == RL);
        if ((int)dVar33 <= iVar27 && PVar7 == RL) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout," ** Max wins: ",0xe);
          std::ostream::_M_insert<double>((double)local_c48._0_8_ * 100.0);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
        std::ostream::flush();
      }
      Game::reset(&local_2f8);
      iVar27 = iVar27 + 1;
    } while (iVar27 < Arguments::plays);
  }
  local_b60._M_dataplus._M_p = (pointer)&local_b60.field_2;
  local_b60._M_string_length = 0;
  local_b60.field_2._M_local_buf[0] = '\0';
  local_940 = (undefined1  [8])CONCAT44(local_940._4_4_,local_940._0_4_);
  if ((PVar7 != RL) ||
     (local_940 = (undefined1  [8])CONCAT44(local_940._4_4_,local_940._0_4_),
     (local_c20.super__Vector_base<Neural_Network,_std::allocator<Neural_Network>_>._M_impl.
      super__Vector_impl_data._M_start)->reserved != true)) goto LAB_00108b76;
  if (local_c20.super__Vector_base<Neural_Network,_std::allocator<Neural_Network>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_c20.super__Vector_base<Neural_Network,_std::allocator<Neural_Network>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar9 = 0xfffffc18;
    lVar25 = -1;
  }
  else {
    local_c50 = -1;
    local_c38 = (Neural_Network *)0xbff0000000000000;
    uVar20 = 0;
    do {
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
      std::ostream::put('8');
      poVar16 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar16,"Testing best agent: Wins || Completion (",0x28);
      poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16," before)",8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
      std::ostream::put((char)poVar16);
      std::ostream::flush();
      local_708.t.
      super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_708.t.
      super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_708.r = 0;
      local_708.c = 0;
      local_708.t.
      super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_728._M_allocated_capacity = 0;
      local_728._8_7_ = 0;
      local_728._M_local_buf[0xf] = '\0';
      local_738 = (undefined1  [8])0x0;
      ppAStack_730 = (pointer)0x0;
      local_6e8 = &p_Stack_6b8;
      local_6e0 = 1;
      local_6d8._M_nxt = (_Hash_node_base *)0x0;
      sStack_6d0 = 0;
      local_6c8 = 1.0;
      local_6c0 = 0;
      p_Stack_6b8 = (__node_base_ptr)0x0;
      local_6b0 = &p_Stack_680;
      local_6a8 = 1;
      local_6a0._M_nxt = (_Hash_node_base *)0x0;
      sStack_698 = 0;
      local_690 = 1.0;
      local_658 = (pointer)0x0;
      local_668 = (pointer)0x0;
      pGStack_660 = (pointer)0x0;
      local_678._0_4_ = 0;
      local_678._4_4_ = 0;
      uStack_670._0_4_ = 0;
      uStack_670._4_4_ = 0;
      local_688 = 0;
      p_Stack_680 = (__node_base_ptr)0x0;
      local_650 = -1;
      iStack_64c = -1;
      iStack_648 = -1;
      iStack_644 = -1;
      local_630.t.
      super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_630.t.
      super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_630.r = 0;
      local_630.c = 0;
      local_630.t.
      super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_610 = &p_Stack_5e0;
      local_608 = 1;
      local_600._M_nxt = (_Hash_node_base *)0x0;
      sStack_5f8 = 0;
      local_5f0 = 1.0;
      local_5e8 = 0;
      p_Stack_5e0 = (__node_base_ptr)0x0;
      local_5d8 = &p_Stack_5a8;
      local_5d0 = 1;
      local_5c8._M_nxt = (_Hash_node_base *)0x0;
      sStack_5c0 = 0;
      local_5b8 = 1.0;
      local_580 = (pointer)0x0;
      local_590 = (pointer)0x0;
      pGStack_588 = (pointer)0x0;
      local_5a0._0_4_ = 0;
      local_5a0._4_4_ = 0;
      uStack_598._0_4_ = 0;
      uStack_598._4_4_ = 0;
      local_5b0 = 0;
      p_Stack_5a8 = (__node_base_ptr)0x0;
      local_578 = -1;
      iStack_574 = -1;
      iStack_570 = -1;
      iStack_56c = -1;
      local_558.t.
      super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_558.t.
      super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_558.r = 0;
      local_558.c = 0;
      local_558.t.
      super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_538 = &p_Stack_508;
      local_530 = 1;
      local_528._M_nxt = (_Hash_node_base *)0x0;
      sStack_520 = 0;
      local_518 = 1.0;
      local_510 = 0;
      p_Stack_508 = (__node_base_ptr)0x0;
      local_500 = &p_Stack_4d0;
      local_4f8 = 1;
      local_4f0._M_nxt = (_Hash_node_base *)0x0;
      sStack_4e8 = 0;
      local_4e0 = 1.0;
      local_4a8 = (pointer)0x0;
      local_4b8 = (pointer)0x0;
      pGStack_4b0 = (pointer)0x0;
      local_4c8._0_4_ = 0;
      local_4c8._4_4_ = 0;
      uStack_4c0._0_4_ = 0;
      uStack_4c0._4_4_ = 0;
      local_4d8 = 0;
      p_Stack_4d0 = (__node_base_ptr)0x0;
      local_4a0 = -1;
      iStack_49c = -1;
      iStack_498 = -1;
      iStack_494 = -1;
      local_480._0_1_ = false;
      local_480._1_1_ = false;
      Game::load_maze((Game *)local_738);
      this = (NN_Pacman_Agent *)operator_new(200);
      NN_Pacman_Agent::NN_Pacman_Agent
                (this,local_c20.super__Vector_base<Neural_Network,_std::allocator<Neural_Network>_>.
                      _M_impl.super__Vector_impl_data._M_start + uVar20);
      local_728._8_7_ = SUB87(this,0);
      local_728._M_local_buf[0xf] = (char)((ulong)this >> 0x38);
      local_940._0_4_ = Arguments::logging_statistics_precision;
      local_8fc = 0;
      uStack_8f8 = 0;
      uStack_8f4 = 0;
      uStack_8f0 = 0;
      uStack_910._4_4_ = 0;
      uStack_908._0_4_ = 0;
      uStack_908._4_4_ = 0;
      uStack_900 = 0;
      local_91c = 0;
      uStack_918._0_4_ = 0;
      uStack_918._4_4_ = 0;
      uStack_910._0_4_ = 0;
      aStack_930._M_allocated_capacity._4_4_ = 0;
      aStack_930._8_4_ = 0;
      aStack_930._12_4_ = 0;
      uStack_920 = 0;
      local_940._4_4_ = 0;
      auStack_938._0_4_ = 0;
      auStack_938._4_4_ = 0;
      aStack_930._M_allocated_capacity._0_4_ = 0;
      local_8ec = 0;
      std::_Deque_base<StatisticInfo,_std::allocator<StatisticInfo>_>::_M_initialize_map
                ((_Deque_base<StatisticInfo,_std::allocator<StatisticInfo>_> *)auStack_938,0);
      local_8c8._0_16_ = ZEXT816(0);
      local_8d8 = ZEXT816(0);
      local_8e8 = ZEXT816(0);
      if (Arguments::n_games_test < 1) {
        local_c48 = ZEXT816(0);
      }
      else {
        local_c48 = ZEXT816(0);
        iVar27 = 0;
        do {
          Game::play((Game *)local_738);
          local_478.first._M_dataplus._M_p = (pointer)(double)(int)bStack_718;
          local_478.first._M_string_length = (size_type)local_710;
          local_478.first.field_2._M_allocated_capacity = 0;
          dVar33 = local_710 + (double)local_8e8._8_8_;
          local_8e8._8_4_ = SUB84(dVar33,0);
          local_8e8._0_8_ = (double)local_478.first._M_dataplus._M_p + (double)local_8e8._0_8_;
          local_8e8._12_4_ = (int)((ulong)dVar33 >> 0x20);
          dVar33 = (double)local_8d8._8_8_ + (double)local_478.first._M_dataplus._M_p;
          local_8d8._8_4_ = SUB84(dVar33,0);
          local_8d8._0_8_ = (double)local_8d8._0_8_ + 0.0;
          local_8d8._12_4_ = (int)((ulong)dVar33 >> 0x20);
          dVar33 = (double)local_8c8._8_8_ + 0.0;
          local_8c8._8_4_ = SUB84(dVar33,0);
          local_8c8._0_8_ = (double)local_8c8._0_8_ + local_710;
          local_8c8._12_4_ = (int)((ulong)dVar33 >> 0x20);
          if (uStack_908 == (_Elt_pointer)(CONCAT44(uStack_8f4,uStack_8f8) + -0x18)) {
            std::deque<StatisticInfo,std::allocator<StatisticInfo>>::
            _M_push_back_aux<StatisticInfo_const&>
                      ((deque<StatisticInfo,std::allocator<StatisticInfo>> *)auStack_938,
                       (StatisticInfo *)&local_478);
            ppSVar6 = uStack_910;
          }
          else {
            uStack_908->mse = 0.0;
            uStack_908->won = (double)local_478.first._M_dataplus._M_p;
            uStack_908->completion = local_710;
            uStack_908 = uStack_908 + 1;
            ppSVar6 = uStack_910;
          }
          if ((uint)local_940._0_4_ <= (uint)local_940._4_4_) {
            pSVar4 = (_Elt_pointer)CONCAT44(aStack_930._12_4_,aStack_930._8_4_);
            if (pSVar4 == uStack_918 + -1) {
              local_c28 = (RL_Pacman_Agent *)pSVar4->mse;
              local_bd8 = pSVar4->won;
              dStack_bd0 = pSVar4->completion;
              uStack_910 = ppSVar6;
              operator_delete((void *)CONCAT44(local_91c,uStack_920));
              ppSVar6 = uStack_910 + 1;
              pSVar12 = uStack_910[1];
              uStack_920 = SUB84(pSVar12,0);
              local_91c = (undefined4)((ulong)pSVar12 >> 0x20);
              uStack_918 = pSVar12 + 0x15;
              dVar30 = local_bd8;
              dVar33 = dStack_bd0;
              pRVar10 = local_c28;
            }
            else {
              pSVar12 = pSVar4 + 1;
              dVar30 = pSVar4->won;
              dVar33 = pSVar4->completion;
              pRVar10 = (RL_Pacman_Agent *)pSVar4->mse;
            }
            aStack_930._8_4_ = SUB84(pSVar12,0);
            aStack_930._12_4_ = (undefined4)((ulong)pSVar12 >> 0x20);
            dVar33 = (double)local_8e8._8_8_ - dVar33;
            local_8e8._8_4_ = SUB84(dVar33,0);
            local_8e8._0_8_ = (double)local_8e8._0_8_ - dVar30;
            local_8e8._12_4_ = (int)((ulong)dVar33 >> 0x20);
            local_8d8._0_8_ = (double)local_8d8._0_8_ - (double)pRVar10;
          }
          uVar9 = local_940._4_4_ + 1;
          local_940._4_4_ = uVar9;
          uStack_910 = ppSVar6;
          if (iVar27 % Arguments::logging_update_rate == Arguments::logging_update_rate + -1) {
            local_c48._8_8_ = local_8c8._0_8_;
            local_c48._0_8_ = local_8d8._8_8_;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\r[",2);
            poVar16 = (ostream *)
                      std::ostream::operator<<((ostream *)&std::cout,(int)(double)local_8d8._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar16,"/",1);
            poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
            std::__ostream_insert<char,std::char_traits<char>>(poVar16,"] ",2);
            dVar33 = (double)uVar9;
            auVar3._8_4_ = SUB84(dVar33,0);
            auVar3._0_8_ = dVar33;
            auVar3._12_4_ = (int)((ulong)dVar33 >> 0x20);
            local_c48 = divpd(local_c48,auVar3);
            poVar16 = std::ostream::_M_insert<double>(local_c48._0_8_ * 100.0);
            std::__ostream_insert<char,std::char_traits<char>>(poVar16,"% || ",5);
            poVar16 = std::ostream::_M_insert<double>((double)local_c48._8_8_ * 100.0);
            std::__ostream_insert<char,std::char_traits<char>>(poVar16,"%",1);
            std::ostream::flush();
          }
          Game::reset((Game *)local_738);
          iVar27 = iVar27 + 1;
        } while (iVar27 < Arguments::n_games_test);
      }
      iVar27 = (int)uVar20;
      if (Arguments::nn_evaluation_attribute == COMPLETION) {
        if ((double)local_c38 < (double)local_c48._8_8_) {
          local_c38 = (Neural_Network *)local_c48._8_8_;
          local_be8 = (Neural_Network *)local_c48._0_8_;
          pNStack_be0 = (Neural_Network *)local_c48._8_8_;
          local_c50 = iVar27;
        }
      }
      else if ((Arguments::nn_evaluation_attribute == WINS) &&
              ((double)local_c38 < (double)local_c48._0_8_)) {
        local_c38 = (Neural_Network *)local_c48._0_8_;
        local_be8 = (Neural_Network *)local_c48._0_8_;
        pNStack_be0 = (Neural_Network *)local_c48._8_8_;
        local_c50 = iVar27;
      }
      std::_Deque_base<StatisticInfo,_std::allocator<StatisticInfo>_>::~_Deque_base
                ((_Deque_base<StatisticInfo,_std::allocator<StatisticInfo>_> *)auStack_938);
      Game::~Game((Game *)local_738);
      uVar20 = (ulong)(iVar27 + 1);
      uVar13 = ((long)local_c20.super__Vector_base<Neural_Network,_std::allocator<Neural_Network>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_c20.super__Vector_base<Neural_Network,_std::allocator<Neural_Network>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) * -0x30c30c30c30c30c3;
    } while (uVar20 <= uVar13 && uVar13 - uVar20 != 0);
    uVar9 = (uint)((double)local_c38 * 1000.0);
    lVar25 = (long)local_c50;
  }
  id_abi_cxx11_();
  plVar14 = (long *)std::__cxx11::string::replace((ulong)&local_ba0,0,(char *)0x0,0x11920c);
  local_478.first._M_dataplus._M_p = (pointer)&local_478.first.field_2;
  paVar28 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar14 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar14 == paVar28) {
    local_478.first.field_2._M_allocated_capacity = paVar28->_M_allocated_capacity;
    local_478.first.field_2._8_8_ = plVar14[3];
  }
  else {
    local_478.first.field_2._M_allocated_capacity = paVar28->_M_allocated_capacity;
    local_478.first._M_dataplus._M_p = (pointer)*plVar14;
  }
  local_478.first._M_string_length = plVar14[1];
  *plVar14 = (long)paVar28;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  plVar14 = (long *)std::__cxx11::string::append((char *)&local_478);
  pcVar1 = auStack_938 + 8;
  plVar21 = plVar14 + 2;
  local_c48._0_8_ = lVar25;
  if ((long *)*plVar14 == plVar21) {
    aStack_930._M_allocated_capacity._0_4_ = (undefined4)*plVar21;
    aStack_930._M_allocated_capacity._4_4_ = (undefined4)((ulong)*plVar21 >> 0x20);
    aStack_930._8_4_ = (undefined4)plVar14[3];
    aStack_930._12_4_ = (undefined4)((ulong)plVar14[3] >> 0x20);
    local_940 = (undefined1  [8])pcVar1;
  }
  else {
    aStack_930._M_allocated_capacity._0_4_ = (undefined4)*plVar21;
    aStack_930._M_allocated_capacity._4_4_ = (undefined4)((ulong)*plVar21 >> 0x20);
    local_940 = (undefined1  [8])*plVar14;
  }
  auStack_938._0_4_ = (undefined4)plVar14[1];
  auStack_938._4_4_ = (undefined4)((ulong)plVar14[1] >> 0x20);
  *plVar14 = (long)plVar21;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  uVar24 = -uVar9;
  if (0 < (int)uVar9) {
    uVar24 = uVar9;
  }
  __len = 1;
  if (9 < uVar24) {
    uVar20 = (ulong)uVar24;
    uVar8 = 4;
    do {
      __len = uVar8;
      uVar18 = (uint)uVar20;
      if (uVar18 < 100) {
        __len = __len - 2;
        goto LAB_0010889b;
      }
      if (uVar18 < 1000) {
        __len = __len - 1;
        goto LAB_0010889b;
      }
      if (uVar18 < 10000) goto LAB_0010889b;
      uVar20 = uVar20 / 10000;
      uVar8 = __len + 4;
    } while (99999 < uVar18);
    __len = __len + 1;
  }
LAB_0010889b:
  local_980._M_dataplus._M_p = (pointer)&local_980.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_980,(char)__len - (char)((int)uVar9 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_980._M_dataplus._M_p + (uVar9 >> 0x1f),__len,uVar24);
  pad(&local_c08,&local_980,'0',3);
  uVar20 = local_c08._M_string_length + CONCAT44(auStack_938._4_4_,auStack_938._0_4_);
  uVar13 = 0xf;
  if (local_940 != (undefined1  [8])pcVar1) {
    uVar13 = CONCAT44(aStack_930._M_allocated_capacity._4_4_,aStack_930._M_allocated_capacity._0_4_)
    ;
  }
  if (uVar13 < uVar20) {
    uVar13 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c08._M_dataplus._M_p != &local_c08.field_2) {
      uVar13 = CONCAT71(local_c08.field_2._M_allocated_capacity._1_7_,
                        local_c08.field_2._M_local_buf[0]);
    }
    if (uVar13 < uVar20) goto LAB_00108944;
    puVar15 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_c08,0,(char *)0x0,(ulong)local_940);
  }
  else {
LAB_00108944:
    puVar15 = (undefined8 *)
              std::__cxx11::string::_M_append(local_940,(ulong)local_c08._M_dataplus._M_p);
  }
  local_738 = (undefined1  [8])&local_728;
  paVar28 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar15 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar15 == paVar28) {
    local_728._M_allocated_capacity = paVar28->_M_allocated_capacity;
    local_728._8_7_ = (undefined7)puVar15[3];
    local_728._M_local_buf[0xf] = (char)((ulong)puVar15[3] >> 0x38);
  }
  else {
    local_728._M_allocated_capacity = paVar28->_M_allocated_capacity;
    local_738 = (undefined1  [8])*puVar15;
  }
  ppAStack_730 = (pointer)puVar15[1];
  *puVar15 = paVar28;
  puVar15[1] = 0;
  paVar28->_M_local_buf[0] = '\0';
  std::__cxx11::string::operator=((string *)&local_b60,(string *)local_738);
  if (local_738 != (undefined1  [8])&local_728) {
    operator_delete((void *)local_738);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c08._M_dataplus._M_p != &local_c08.field_2) {
    operator_delete(local_c08._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_980._M_dataplus._M_p != &local_980.field_2) {
    operator_delete(local_980._M_dataplus._M_p);
  }
  if (local_940 != (undefined1  [8])pcVar1) {
    operator_delete((void *)local_940);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_478.first._M_dataplus._M_p != &local_478.first.field_2) {
    operator_delete(local_478.first._M_dataplus._M_p);
  }
  if (local_ba0 != local_b90) {
    operator_delete(local_ba0);
  }
  system("mkdir -p ../data/neural-networks");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_940,
                 "../data/neural-networks/",&local_b60);
  puVar15 = (undefined8 *)std::__cxx11::string::append(local_940);
  paVar28 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar15 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar15 == paVar28) {
    local_728._M_allocated_capacity = paVar28->_M_allocated_capacity;
    local_728._8_7_ = (undefined7)puVar15[3];
    local_728._M_local_buf[0xf] = (char)((ulong)puVar15[3] >> 0x38);
    local_738 = (undefined1  [8])&local_728;
  }
  else {
    local_728._M_allocated_capacity = paVar28->_M_allocated_capacity;
    local_738 = (undefined1  [8])*puVar15;
  }
  ppAStack_730 = (pointer)puVar15[1];
  *puVar15 = paVar28;
  puVar15[1] = 0;
  *(undefined1 *)(puVar15 + 2) = 0;
  if (local_940 != (undefined1  [8])pcVar1) {
    operator_delete((void *)local_940);
  }
  Neural_Network::write_file
            (local_c20.super__Vector_base<Neural_Network,_std::allocator<Neural_Network>_>._M_impl.
             super__Vector_impl_data._M_start + local_c48._0_8_,(string *)local_738);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  poVar16 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar16,"Written best agent\'s neural network to ",0x27);
  std::__ostream_insert<char,std::char_traits<char>>(poVar16,(char *)local_738,(long)ppAStack_730);
  if (local_738 != (undefined1  [8])&local_728) {
    operator_delete((void *)local_738);
  }
LAB_00108b76:
  if (Arguments::non_interactive == true) {
    Arguments::create_json_abi_cxx11_();
    local_ba0 = local_b90;
    local_b98 = 0;
    local_b90[0] = 0;
    std::__cxx11::stringstream::stringstream
              ((stringstream *)local_940,(string *)&local_ba0,_S_out|_S_in);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector(&local_9d0,&local_9b8);
    write_json(&local_9d0,(ostream *)(auStack_938 + 8));
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_9d0);
    system("mkdir -p ../data/statistics");
    local_c08._M_dataplus._M_p = (pointer)&local_c08.field_2;
    local_c08._M_string_length = 0;
    local_c08.field_2._M_local_buf[0] = '\0';
    if (PVar7 == RL) {
      std::__cxx11::string::substr((ulong)&local_bc0,(ulong)&local_b60);
      puVar15 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_bc0,0,(char *)0x0,0x11985e);
      local_478.first._M_dataplus._M_p = (pointer)&local_478.first.field_2;
      paVar28 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar15 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar15 == paVar28) {
        local_478.first.field_2._M_allocated_capacity = paVar28->_M_allocated_capacity;
        local_478.first.field_2._8_8_ = puVar15[3];
      }
      else {
        local_478.first.field_2._M_allocated_capacity = paVar28->_M_allocated_capacity;
        local_478.first._M_dataplus._M_p = (pointer)*puVar15;
      }
      local_478.first._M_string_length = puVar15[1];
      *puVar15 = paVar28;
      puVar15[1] = 0;
      *(undefined1 *)(puVar15 + 2) = 0;
      plVar14 = (long *)std::__cxx11::string::append((char *)&local_478);
    }
    else {
      id_abi_cxx11_();
      puVar15 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_bc0,0,(char *)0x0,0x11985e);
      local_478.first._M_dataplus._M_p = (pointer)&local_478.first.field_2;
      paVar28 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar15 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar15 == paVar28) {
        local_478.first.field_2._M_allocated_capacity = paVar28->_M_allocated_capacity;
        local_478.first.field_2._8_8_ = puVar15[3];
      }
      else {
        local_478.first.field_2._M_allocated_capacity = paVar28->_M_allocated_capacity;
        local_478.first._M_dataplus._M_p = (pointer)*puVar15;
      }
      local_478.first._M_string_length = puVar15[1];
      *puVar15 = paVar28;
      puVar15[1] = 0;
      *(undefined1 *)(puVar15 + 2) = 0;
      plVar14 = (long *)std::__cxx11::string::append((char *)&local_478);
    }
    paVar28 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar14 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar14 == paVar28) {
      local_728._M_allocated_capacity = paVar28->_M_allocated_capacity;
      local_728._8_7_ = (undefined7)plVar14[3];
      local_728._M_local_buf[0xf] = (char)((ulong)plVar14[3] >> 0x38);
      local_738 = (undefined1  [8])&local_728;
    }
    else {
      local_728._M_allocated_capacity = paVar28->_M_allocated_capacity;
      local_738 = (undefined1  [8])*plVar14;
    }
    ppAStack_730 = (pointer)plVar14[1];
    *plVar14 = (long)paVar28;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_c08,(string *)local_738);
    if (local_738 != (undefined1  [8])&local_728) {
      operator_delete((void *)local_738);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_478.first._M_dataplus._M_p != &local_478.first.field_2) {
      operator_delete(local_478.first._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_bc0._M_dataplus._M_p != &local_bc0.field_2) {
      operator_delete(local_bc0._M_dataplus._M_p);
    }
    std::ofstream::ofstream(local_738);
    std::ofstream::open((string *)local_738,(_Ios_Openmode)&local_c08);
    std::__cxx11::stringbuf::str();
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[10],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_478,(char (*) [10])"arguments",&local_bc0);
    __gnu_cxx::__to_xstring<std::__cxx11::string,char>
              (&local_758,vsnprintf,0x148,"%f",local_be8._0_4_);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[5],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_438,(char (*) [5])"wins",&local_758);
    __gnu_cxx::__to_xstring<std::__cxx11::string,char>
              (&local_778,vsnprintf,0x148,"%f",pNStack_be0._0_4_);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[11],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_3f8,(char (*) [11])"completion",&local_778);
    uVar9 = local_b40._0_4_;
    if ((uint)local_b40._4_4_ < (uint)local_b40._0_4_) {
      uVar9 = local_b40._4_4_;
    }
    uVar24 = 1;
    if (1 < (int)uVar9) {
      uVar24 = uVar9;
    }
    __gnu_cxx::__to_xstring<std::__cxx11::string,char>
              (&local_798,vsnprintf,0x148,"%f",SUB84(local_ad8 / (double)(int)uVar24,0));
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[4],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_3b8,(char (*) [4])"mse",&local_798);
    if (PVar7 == RL) {
      std::operator+(&local_7b8,'\"',&local_b60);
      plVar14 = (long *)std::__cxx11::string::_M_replace_aux
                                  ((ulong)&local_7b8,local_7b8._M_string_length,0,'\x01');
      local_b80._M_dataplus._M_p = (pointer)&local_b80.field_2;
      psVar22 = (size_type *)(plVar14 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar14 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar22) {
        local_b80.field_2._M_allocated_capacity = *psVar22;
        local_b80.field_2._8_8_ = plVar14[3];
      }
      else {
        local_b80.field_2._M_allocated_capacity = *psVar22;
        local_b80._M_dataplus._M_p = (pointer)*plVar14;
      }
      local_b80._M_string_length = plVar14[1];
      *plVar14 = (long)psVar22;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
    }
    else {
      local_b80._M_dataplus._M_p = (pointer)&local_b80.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b80,"null","");
    }
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[15],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_378,(char (*) [15])"neural_network",&local_b80);
    uVar13 = time((time_t *)0x0);
    uVar20 = -uVar13;
    if (0 < (long)uVar13) {
      uVar20 = uVar13;
    }
    uVar9 = 1;
    if (9 < uVar20) {
      uVar23 = uVar20;
      uVar24 = 4;
      do {
        uVar9 = uVar24;
        if (uVar23 < 100) {
          uVar9 = uVar9 - 2;
          goto LAB_00109096;
        }
        if (uVar23 < 1000) {
          uVar9 = uVar9 - 1;
          goto LAB_00109096;
        }
        if (uVar23 < 10000) goto LAB_00109096;
        bVar29 = 99999 < uVar23;
        uVar23 = uVar23 / 10000;
        uVar24 = uVar9 + 4;
      } while (bVar29);
      uVar9 = uVar9 + 1;
    }
LAB_00109096:
    local_9a0._M_dataplus._M_p = (pointer)&local_9a0.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_9a0,(char)uVar9 - (char)((long)uVar13 >> 0x3f))
    ;
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_9a0._M_dataplus._M_p + -((long)uVar13 >> 0x3f),uVar9,uVar20);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[10],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_338,(char (*) [10])"timestamp",&local_9a0);
    __l._M_len = 6;
    __l._M_array = &local_478;
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector(&local_a30,__l,&local_c49);
    lVar25 = -0x180;
    paVar28 = &local_338.second.field_2;
    do {
      if (paVar28 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*(undefined1 **)(paVar28->_M_local_buf + -0x10)) {
        operator_delete(*(undefined1 **)(paVar28->_M_local_buf + -0x10));
      }
      if (paVar28->_M_local_buf + -0x20 != *(char **)(paVar28->_M_local_buf + -0x30)) {
        operator_delete(*(char **)(paVar28->_M_local_buf + -0x30));
      }
      paVar28 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(paVar28->_M_local_buf + -0x40);
      lVar25 = lVar25 + 0x40;
    } while (lVar25 != 0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_9a0._M_dataplus._M_p != &local_9a0.field_2) {
      operator_delete(local_9a0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b80._M_dataplus._M_p != &local_b80.field_2) {
      operator_delete(local_b80._M_dataplus._M_p);
    }
    if ((PVar7 == RL) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7b8._M_dataplus._M_p != &local_7b8.field_2)) {
      operator_delete(local_7b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_798._M_dataplus._M_p != &local_798.field_2) {
      operator_delete(local_798._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_778._M_dataplus._M_p != &local_778.field_2) {
      operator_delete(local_778._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_758._M_dataplus._M_p != &local_758.field_2) {
      operator_delete(local_758._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_bc0._M_dataplus._M_p != &local_bc0.field_2) {
      operator_delete(local_bc0._M_dataplus._M_p);
    }
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector(&local_9e8,&local_a30);
    write_json(&local_9e8,(ostream *)local_738);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_9e8);
    std::ofstream::close();
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
    std::ostream::put('8');
    poVar16 = (ostream *)std::ostream::flush();
    std::operator+(&local_478.first,"Written statistics information to ",&local_c08);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar16,local_478.first._M_dataplus._M_p,local_478.first._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_478.first._M_dataplus._M_p != &local_478.first.field_2) {
      operator_delete(local_478.first._M_dataplus._M_p);
    }
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector(&local_a00,&local_a30);
    write_json(&local_a00,(ostream *)&std::cerr);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_a00);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_a30);
    local_738 = (undefined1  [8])_VTT;
    *(undefined8 *)(local_738 + (&_VTT->_M_allocated_capacity)[-3]) = _sqrt;
    std::filebuf::~filebuf((filebuf *)&ppAStack_730);
    std::ios_base::~ios_base(local_640);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c08._M_dataplus._M_p != &local_c08.field_2) {
      operator_delete(local_c08._M_dataplus._M_p);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_940);
    std::ios_base::~ios_base((ios_base *)(local_8c8 + 8));
    if (local_ba0 != local_b90) {
      operator_delete(local_ba0);
    }
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_9b8);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b60._M_dataplus._M_p != &local_b60.field_2) {
    operator_delete(local_b60._M_dataplus._M_p);
  }
  std::vector<Neural_Network,_std::allocator<Neural_Network>_>::~vector(&local_a18);
  std::vector<Neural_Network,_std::allocator<Neural_Network>_>::~vector(&local_c20);
  std::_Deque_base<StatisticInfo,_std::allocator<StatisticInfo>_>::~_Deque_base
            ((_Deque_base<StatisticInfo,_std::allocator<StatisticInfo>_> *)(local_ab4 + 4));
  std::_Deque_base<StatisticInfo,_std::allocator<StatisticInfo>_>::~_Deque_base
            ((_Deque_base<StatisticInfo,_std::allocator<StatisticInfo>_> *)(local_b40 + 8));
  Game::~Game(&local_2f8);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
    cout.setf(ios::fixed);
    cout.precision(1);

    Arguments::init(argc, argv);
    Arguments::postprocess();

    srand(Arguments::random_seed);

    Game game;

    game.load_maze();

    Agent* pacman_ai;

    switch (Arguments::pacman_ai_agent) {
        case PATHFINDING: pacman_ai = new Pathfinding_Pacman_Agent(); break;
        case INPUT: pacman_ai = new Input_Pacman_Agent(); break;
        case RANDOM: pacman_ai = new Random_Pacman_Agent(); break;
        case RL: pacman_ai = new RL_Pacman_Agent(); break;
        case NN: pacman_ai = new NN_Pacman_Agent(Arguments::neural_network_path); break;
        default: ensure(false, "Invalid pacman AI Agent enum value");
    }

    game.set_ai(pacman_ai);

    Statistics s_log(Arguments::logging_statistics_precision);
    Statistics s_test(Arguments::test_statistics_precision);

    double max_win_ratio = -1;
    vector<Neural_Network> max_nns(Arguments::test_sampling);
    vector<Neural_Network> last_nns(Arguments::test_sampling);


    bool is_rl = Arguments::pacman_ai_agent == RL;
    cout << "Wins || Completion" << (is_rl ? " || MSE" : "") <<  " (Last " << s_log.precision << " :: Always)" << endl;

    /** TRAINING STAGE **/
    int i_start_evaluation = Arguments::plays*Arguments::nn_evaluation_start;
    for (int i = 0; i < Arguments::plays; ++i) {
        if (is_rl and i%Arguments::test_sampling_interval == 0)
            last_nns[(i%Arguments::test_statistics_precision)/Arguments::test_sampling_interval].from_weights(((RL_Pacman_Agent *) (pacman_ai))->nn);

        game.play();

        double mse = is_rl ? ((RL_Pacman_Agent*)(pacman_ai))->mse_sum_last/game.state.round : 0;
        StatisticInfo info(game.result, mse);
        s_log.new_observation(info);
        s_test.new_observation(info);

        double win_ratio_test;
        if (i >= i_start_evaluation and is_rl) {
            if (Arguments::nn_evaluation_attribute == WINS) win_ratio_test = s_test.avg().won;
            else win_ratio_test = s_test.avg().completion;

            if (win_ratio_test > max_win_ratio) {
                max_win_ratio = win_ratio_test;
                for (uint j = 0; j < max_nns.size(); ++j) max_nns[j].from_weights(last_nns[j]);
            }
        }

        if (i%Arguments::logging_update_rate == Arguments::logging_update_rate - 1) {
            cout << "\r";
            print_info(s_log, is_rl);
            if (is_rl and i >= i_start_evaluation) cout << " ** Max wins: " << 100*max_win_ratio;
            cout << "  ";
            cout.flush();
        }

        game.reset();
    }

    string nn_id;

    double maxtestcompletion;
    double maxtestwins;
    /** TESTING STAGE **/
    if (is_rl and max_nns[0].reserved) {
        int maxtest = -1;
        double maxtestevaluation = -1;

        for (uint j = 0; j < max_nns.size(); ++j) {
            cout << endl << "Testing best agent: Wins || Completion ("
                 << Arguments::test_statistics_precision - j*Arguments::test_sampling_interval << " before)" << endl;

            Game game_test;
            game_test.load_maze();
            pacman_ai = new NN_Pacman_Agent(max_nns[j]);
            game_test.set_ai(pacman_ai);

            Statistics s_log_test(Arguments::logging_statistics_precision);
            StatisticInfo avg;

            for (int i = 0; i < Arguments::n_games_test; ++i) {
                game_test.play();

                s_log_test.new_observation(StatisticInfo(game_test.result));

                if (i%Arguments::logging_update_rate == Arguments::logging_update_rate - 1) {
                    avg = s_log_test.avg_always();
                    cout << "\r[" << int(s_log_test.totals_always.won) << "/" << s_log_test.observation_count << "] "
                         << 100*avg.won << "% || " << 100*avg.completion << "%";

                    cout.flush();
                }

                game_test.reset();
            }

            if (Arguments::nn_evaluation_attribute == WINS and avg.won > maxtestevaluation) {
                maxtestevaluation = avg.won;
                maxtestwins = avg.won;
                maxtestcompletion = avg.completion;
                maxtest = j;

            }
            else if (Arguments::nn_evaluation_attribute == COMPLETION and avg.completion > maxtestevaluation) {
                maxtestevaluation = avg.completion;
                maxtestwins = avg.won;
                maxtestcompletion = avg.completion;
                maxtest = j;
            }
        }

        nn_id = "nn" + id() + "-" + pad(to_string(int(1000*maxtestevaluation)), '0', 3);

        system("mkdir -p ../data/neural-networks");
        string nn_path = "../data/neural-networks/" + nn_id + ".txt";
        max_nns[maxtest].write_file(nn_path);
        cout << endl << "Written best agent's neural network to " << nn_path;
    }

    if (Arguments::non_interactive) {
        vector<pair<string, string>> arguments = Arguments::create_json();

        string arguments_json;
        stringstream ss(arguments_json);
        write_json(arguments, ss);

        system("mkdir -p ../data/statistics");

        string statistics_path;
        if (is_rl)
            statistics_path = "../data/statistics/" + nn_id.substr(2) + ".json";
        else
            statistics_path = "../data/statistics/" + id() + "-test.json";

        ofstream file;
        file.open(statistics_path);

        vector<pair<string, string>> json = {
                { "arguments", ss.str() },
                { "wins", to_string(maxtestwins) },
                { "completion", to_string(maxtestcompletion) },
                { "mse", to_string(s_log.avg().mse) },
                { "neural_network", (is_rl ? ('"' + nn_id + '"') : "null") },
                { "timestamp", to_string(time(0)) }
        };

        write_json(json, file);

        file.close();

        cout << endl << "Written statistics information to " + statistics_path;

        write_json(json, cerr);
    }

    cout << endl;
}